

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form_test.cpp
# Opt level: O0

void __thiscall unit_test::main(unit_test *this,string *a_case)

{
  _func_int *p_Var1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference pbVar7;
  ostream *poVar8;
  void *pvVar9;
  undefined8 uVar10;
  double dVar11;
  reference rVar12;
  form_context context_2;
  submit s;
  const_iterator p_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids_1;
  uint i_1;
  vector<bool,_std::allocator<bool>_> v_1;
  ostream *out_2;
  form_context context_1;
  form_context context;
  ostream *out_1;
  const_iterator p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  uint i;
  vector<bool,_std::allocator<bool>_> v;
  ostream *out;
  form b;
  form a2;
  form a1;
  form a;
  form X;
  file file;
  submit submit;
  radio radio;
  select select;
  select_multiple select_multiple;
  checkbox checkbox;
  email email;
  regex_field regex;
  password p2;
  password p1;
  numeric<double> real;
  numeric<int> integer;
  textarea textarea;
  text text;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc828;
  basic_message<char> *in_stack_ffffffffffffc830;
  double in_stack_ffffffffffffc838;
  allocator *paVar13;
  numeric<double> *in_stack_ffffffffffffc840;
  size_type in_stack_ffffffffffffc848;
  undefined7 in_stack_ffffffffffffc850;
  undefined1 in_stack_ffffffffffffc857;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc860;
  undefined6 in_stack_ffffffffffffc868;
  undefined1 in_stack_ffffffffffffc86e;
  undefined1 in_stack_ffffffffffffc86f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffc870;
  form *in_stack_ffffffffffffc8a8;
  long lVar14;
  unit_test *in_stack_ffffffffffffc8b0;
  byte local_33fa;
  undefined1 local_32a9 [40];
  allocator local_3281;
  string local_3280 [39];
  allocator local_3259;
  string local_3258 [32];
  regex local_3238 [15];
  allocator local_3229;
  string local_3228 [39];
  allocator local_3201;
  string local_3200 [32];
  form_context local_31e0 [559];
  allocator local_2fb1;
  string local_2fb0 [39];
  allocator local_2f89;
  string local_2f88 [32];
  long local_2f68 [88];
  string local_2ca8 [32];
  string local_2c88 [32];
  _Self local_2c68;
  _Self local_2c60 [7];
  reference local_2c28;
  uint local_2c14;
  ostream *local_2be8;
  string local_2be0 [32];
  form_context local_2bc0 [40];
  string local_2b98 [32];
  string local_2b78 [32];
  string local_2b58 [32];
  form_context local_2b38 [40];
  ostream *local_2b10;
  string local_2b08 [32];
  string local_2ae8 [32];
  _Self local_2ac8;
  _Self local_2ac0 [7];
  uint local_2a84;
  string local_2a58 [32];
  string local_2a38 [32];
  string local_2a18 [32];
  string local_29f8 [32];
  string local_29d8 [32];
  string local_29b8 [32];
  ostream *local_2998;
  byte local_2989;
  string local_2988 [32];
  request local_2968 [32];
  form local_2948 [48];
  form local_2918 [48];
  form local_28e8 [48];
  form local_28b8 [48];
  form local_2888 [55];
  allocator local_2851;
  string local_2850 [32];
  string local_2830 [135];
  allocator local_27a9;
  string local_27a8 [39];
  allocator local_2781;
  string local_2780 [39];
  allocator local_2759;
  string local_2758 [39];
  allocator local_2731;
  string local_2730 [32];
  string local_2710 [135];
  allocator local_2689;
  string local_2688 [39];
  allocator local_2661;
  string local_2660 [39];
  allocator local_2639;
  string local_2638 [39];
  allocator local_2611;
  string local_2610 [32];
  string local_25f0 [135];
  allocator local_2569;
  string local_2568 [39];
  allocator local_2541;
  string local_2540 [39];
  allocator local_2519;
  string local_2518 [39];
  allocator local_24f1;
  string local_24f0 [39];
  allocator local_24c9;
  string local_24c8 [39];
  allocator local_24a1;
  string local_24a0 [39];
  allocator local_2479;
  string local_2478 [39];
  allocator local_2451;
  string local_2450 [39];
  allocator local_2429;
  string local_2428 [39];
  allocator local_2401;
  string local_2400 [39];
  allocator local_23d9;
  string local_23d8 [39];
  allocator local_23b1;
  string local_23b0 [39];
  allocator local_2389;
  string local_2388 [39];
  allocator local_2361;
  string local_2360 [39];
  allocator local_2339;
  string local_2338 [39];
  allocator local_2311;
  string local_2310 [39];
  allocator local_22e9;
  string local_22e8 [32];
  long local_22c8 [84];
  long local_2028 [88];
  radio local_1d68 [576];
  select local_1b28 [568];
  select_multiple local_18f0 [560];
  long local_16c0 [76];
  long local_1460 [84];
  allocator local_11b9;
  string local_11b8 [32];
  long local_1198 [83];
  long local_f00 [83];
  long local_c68 [83];
  numeric<double> local_9d0;
  numeric<int> local_760;
  long local_4f0 [75];
  long local_298 [6];
  undefined1 local_268 [616];
  
  cppcms::widgets::text::text((text *)local_298);
  cppcms::widgets::textarea::textarea((textarea *)local_4f0);
  cppcms::widgets::numeric<int>::numeric((numeric<int> *)in_stack_ffffffffffffc870);
  cppcms::widgets::numeric<double>::numeric((numeric<double> *)in_stack_ffffffffffffc870);
  cppcms::widgets::password::password((password *)local_c68);
  cppcms::widgets::password::password((password *)local_f00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11b8,"^(yes|no)$",&local_11b9);
  cppcms::widgets::regex_field::regex_field((regex_field *)local_1198,local_11b8);
  std::__cxx11::string::~string(local_11b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
  cppcms::widgets::email::email((email *)local_1460);
  cppcms::widgets::checkbox::checkbox((checkbox *)local_16c0);
  cppcms::widgets::select_multiple::select_multiple(local_18f0);
  cppcms::widgets::select::select(local_1b28);
  cppcms::widgets::radio::radio(local_1d68);
  cppcms::widgets::submit::submit((submit *)local_2028);
  cppcms::widgets::file::file((file *)local_22c8);
  lVar14 = *(long *)(local_298[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22e8,"text",&local_22e9);
  cppcms::widgets::base_widget::message((long)local_298 + lVar14,local_22e8);
  std::__cxx11::string::~string(local_22e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_22e9);
  lVar14 = *(long *)(local_4f0[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2310,"textarea",&local_2311);
  cppcms::widgets::base_widget::message((long)local_4f0 + lVar14,local_2310);
  std::__cxx11::string::~string(local_2310);
  std::allocator<char>::~allocator((allocator<char> *)&local_2311);
  p_Var1 = local_760.super_base_html_input._vptr_base_html_input[-3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2338,"int",&local_2339);
  cppcms::widgets::base_widget::message(p_Var1 + (long)&local_760.super_base_html_input,local_2338);
  std::__cxx11::string::~string(local_2338);
  std::allocator<char>::~allocator((allocator<char> *)&local_2339);
  p_Var1 = local_9d0.super_base_html_input._vptr_base_html_input[-3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2360,"double",&local_2361);
  cppcms::widgets::base_widget::message(p_Var1 + (long)&local_9d0.super_base_html_input,local_2360);
  std::__cxx11::string::~string(local_2360);
  std::allocator<char>::~allocator((allocator<char> *)&local_2361);
  lVar14 = *(long *)(local_c68[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2388,"pass",&local_2389);
  cppcms::widgets::base_widget::message((long)local_c68 + lVar14,local_2388);
  std::__cxx11::string::~string(local_2388);
  std::allocator<char>::~allocator((allocator<char> *)&local_2389);
  lVar14 = *(long *)(local_f00[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23b0,"pass2",&local_23b1);
  cppcms::widgets::base_widget::message((long)local_f00 + lVar14,local_23b0);
  std::__cxx11::string::~string(local_23b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23b1);
  lVar14 = *(long *)(local_1198[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23d8,"yes or not",&local_23d9);
  cppcms::widgets::base_widget::message((long)local_1198 + lVar14,local_23d8);
  std::__cxx11::string::~string(local_23d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_23d9);
  lVar14 = *(long *)(local_1460[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2400,"E-Mail",&local_2401);
  cppcms::widgets::base_widget::message((long)local_1460 + lVar14,local_2400);
  std::__cxx11::string::~string(local_2400);
  std::allocator<char>::~allocator((allocator<char> *)&local_2401);
  lVar14 = *(long *)(local_16c0[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2428,"Checkbox",&local_2429);
  cppcms::widgets::base_widget::message((long)local_16c0 + lVar14,local_2428);
  std::__cxx11::string::~string(local_2428);
  std::allocator<char>::~allocator((allocator<char> *)&local_2429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2450,"Select Multiple",&local_2451);
  cppcms::widgets::base_widget::message(local_18f0,local_2450);
  std::__cxx11::string::~string(local_2450);
  std::allocator<char>::~allocator((allocator<char> *)&local_2451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2478,"Select",&local_2479);
  cppcms::widgets::base_widget::message(local_1b28,local_2478);
  std::__cxx11::string::~string(local_2478);
  std::allocator<char>::~allocator((allocator<char> *)&local_2479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24a0,"Radio",&local_24a1);
  cppcms::widgets::base_widget::message(local_1d68,local_24a0);
  std::__cxx11::string::~string(local_24a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24a1);
  lVar14 = *(long *)(local_2028[0] + -0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24c8,"Submit",&local_24c9);
  cppcms::widgets::base_widget::message((long)local_2028 + lVar14,local_24c8);
  std::__cxx11::string::~string(local_24c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24f0,"Button",&local_24f1);
  cppcms::widgets::submit::value(local_2028,local_24f0);
  std::__cxx11::string::~string(local_24f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2518,"a",&local_2519);
  cppcms::widgets::select_multiple::add((string *)local_18f0,SUB81(local_2518,0));
  std::__cxx11::string::~string(local_2518);
  std::allocator<char>::~allocator((allocator<char> *)&local_2519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2540,"b",&local_2541);
  cppcms::widgets::select_multiple::add((string *)local_18f0,SUB81(local_2540,0));
  std::__cxx11::string::~string(local_2540);
  std::allocator<char>::~allocator((allocator<char> *)&local_2541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2568,"c",&local_2569);
  cppcms::widgets::select_multiple::add((string *)local_18f0,SUB81(local_2568,0));
  std::__cxx11::string::~string(local_2568);
  std::allocator<char>::~allocator((allocator<char> *)&local_2569);
  booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2610,"id1",&local_2611);
  cppcms::widgets::select_multiple::add((basic_message *)local_18f0,local_25f0,SUB81(local_2610,0));
  std::__cxx11::string::~string(local_2610);
  std::allocator<char>::~allocator((allocator<char> *)&local_2611);
  booster::locale::basic_message<char>::~basic_message(in_stack_ffffffffffffc830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2638,"a",&local_2639);
  cppcms::widgets::select_base::add((string *)local_1b28);
  std::__cxx11::string::~string(local_2638);
  std::allocator<char>::~allocator((allocator<char> *)&local_2639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2660,"b",&local_2661);
  cppcms::widgets::select_base::add((string *)local_1b28);
  std::__cxx11::string::~string(local_2660);
  std::allocator<char>::~allocator((allocator<char> *)&local_2661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2688,"c",&local_2689);
  cppcms::widgets::select_base::add((string *)local_1b28);
  std::__cxx11::string::~string(local_2688);
  std::allocator<char>::~allocator((allocator<char> *)&local_2689);
  booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2730,"id2",&local_2731);
  cppcms::widgets::select_base::add((basic_message *)local_1b28,local_2710);
  std::__cxx11::string::~string(local_2730);
  std::allocator<char>::~allocator((allocator<char> *)&local_2731);
  booster::locale::basic_message<char>::~basic_message(in_stack_ffffffffffffc830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2758,"id2",&local_2759);
  cppcms::widgets::select_base::selected_id(local_1b28,local_2758);
  std::__cxx11::string::~string(local_2758);
  std::allocator<char>::~allocator((allocator<char> *)&local_2759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2780,"x",&local_2781);
  cppcms::widgets::select_base::add((string *)local_1d68);
  std::__cxx11::string::~string(local_2780);
  std::allocator<char>::~allocator((allocator<char> *)&local_2781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_27a8,"y",&local_27a9);
  cppcms::widgets::select_base::add((string *)local_1d68);
  std::__cxx11::string::~string(local_27a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27a9);
  booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2850,"id3",&local_2851);
  cppcms::widgets::select_base::add((basic_message *)local_1d68,local_2830);
  std::__cxx11::string::~string(local_2850);
  std::allocator<char>::~allocator((allocator<char> *)&local_2851);
  booster::locale::basic_message<char>::~basic_message(in_stack_ffffffffffffc830);
  cppcms::widgets::select_base::selected((int)local_1d68);
  cppcms::form::form(local_2888);
  cppcms::form::form(local_28b8);
  cppcms::form::form(local_28e8);
  cppcms::form::form(local_2918);
  cppcms::form::form(local_2948);
  uVar5 = std::__cxx11::string::empty();
  if ((((uVar5 & 1) != 0) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828), bVar2))
     || (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828),
        bVar2)) {
    cppcms::form::add((base_widget *)local_2888);
    cppcms::form::add(local_2888);
    cppcms::form::add(local_2888);
    cppcms::form::add(local_28b8);
    cppcms::form::add(local_28b8);
    cppcms::form::add((base_widget *)local_28e8);
    cppcms::form::add((base_widget *)local_2918);
    cppcms::form::add((base_widget *)local_2918);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2948);
    cppcms::form::add((base_widget *)local_2888);
    cppcms::form::add((base_widget *)local_2888);
    cppcms::form::add((base_widget *)local_2888);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::numeric<int>::non_empty(&local_760);
      cppcms::widgets::numeric<double>::non_empty(&local_9d0);
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::base_text::non_empty();
      cppcms::widgets::select_multiple::non_empty();
      cppcms::widgets::select_base::non_empty();
      cppcms::widgets::select_base::non_empty();
    }
    local_2989 = 0;
    cppcms::application::request();
    cppcms::http::request::request_method_abi_cxx11_(local_2968);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
    local_33fa = 1;
    if (!bVar2) {
      cppcms::application::request();
      cppcms::http::request::query_string_abi_cxx11_();
      local_2989 = 1;
      local_33fa = std::__cxx11::string::empty();
      local_33fa = local_33fa ^ 0xff;
    }
    if ((local_2989 & 1) != 0) {
      std::__cxx11::string::~string(local_2988);
    }
    std::__cxx11::string::~string((string *)local_2968);
    if ((local_33fa & 1) == 0) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
      if (bVar2) {
        cppcms::application::response();
        local_2b10 = (ostream *)cppcms::http::response::out();
        std::operator<<(local_2b10,"non loaded<br>\n");
        cppcms::form_context::form_context(local_2b38,local_2b10,0);
        poVar8 = std::operator<<(local_2b10,"<form action=\"");
        cppcms::application::request();
        cppcms::http::request::script_name_abi_cxx11_();
        cppcms::application::request();
        cppcms::http::request::path_info_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffc86f,
                                CONCAT16(in_stack_ffffffffffffc86e,in_stack_ffffffffffffc868)),
                       in_stack_ffffffffffffc860);
        poVar8 = std::operator<<(poVar8,local_2b58);
        std::operator<<(poVar8,"\" method=\"post\" >\n");
        std::__cxx11::string::~string(local_2b58);
        std::__cxx11::string::~string(local_2b98);
        std::__cxx11::string::~string(local_2b78);
        cppcms::form::render((form_context *)local_2888);
        std::operator<<(local_2b10,"</form>\n");
        cppcms::form_context::~form_context(local_2b38);
      }
      else {
        cppcms::application::response();
        uVar10 = cppcms::http::response::out();
        cppcms::form_context::form_context(local_2bc0,uVar10,0);
        cppcms::form::render((form_context *)local_2948);
        cppcms::form_context::~form_context(local_2bc0);
      }
    }
    else {
      cppcms::application::response();
      cppcms::http::response::set_plain_text_header();
      cppcms::application::response();
      local_2998 = (ostream *)cppcms::http::response::out();
      cppcms::application::context();
      cppcms::form::load((context *)local_2888);
      bVar3 = cppcms::form::validate();
      if ((bVar3 & 1) == 0) {
        poVar8 = std::operator<<(local_2998,"invalid");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar8 = std::operator<<(local_2998,"valid");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Text:");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_29b8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_29b8);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Textarea:");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_29d8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_29d8);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Int:");
        iVar4 = cppcms::widgets::numeric<int>::value((numeric<int> *)in_stack_ffffffffffffc870);
        pvVar9 = (void *)std::ostream::operator<<(poVar8,iVar4);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Double:");
        dVar11 = cppcms::widgets::numeric<double>::value
                           ((numeric<double> *)in_stack_ffffffffffffc870);
        pvVar9 = (void *)std::ostream::operator<<(poVar8,dVar11);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"p1:");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_29f8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_29f8);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"p2:");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_2a18);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2a18);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"regex: ");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_2a38);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2a38);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"email: ");
        cppcms::widgets::base_text::value_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_2a58);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2a58);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"checkbox: ");
        bVar3 = cppcms::widgets::checkbox::value();
        pvVar9 = (void *)std::ostream::operator<<(poVar8,(bool)(bVar3 & 1));
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        std::operator<<(local_2998,"selected m:");
        cppcms::widgets::select_multiple::selected_map();
        for (local_2a84 = 0; uVar5 = (ulong)local_2a84,
            sVar6 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffc870),
            uVar5 < sVar6; local_2a84 = local_2a84 + 1) {
          poVar8 = (ostream *)std::ostream::operator<<(local_2998,local_2a84);
          std::operator<<(poVar8," ");
        }
        std::ostream::operator<<(local_2998,std::endl<char,std::char_traits<char>>);
        cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
        std::operator<<(local_2998,"selected m ids:");
        local_2ac0[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_ffffffffffffc828);
        while( true ) {
          local_2ac8._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_ffffffffffffc828);
          bVar2 = std::operator!=(local_2ac0,&local_2ac8);
          poVar8 = local_2998;
          if (!bVar2) break;
          pbVar7 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_ffffffffffffc830);
          poVar8 = std::operator<<(poVar8,(string *)pbVar7);
          std::operator<<(poVar8," ");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffc830);
        }
        std::ostream::operator<<(local_2998,std::endl<char,std::char_traits<char>>);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x11393b);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x113948);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Select: selected ");
        iVar4 = cppcms::widgets::select_base::selected();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
        poVar8 = std::operator<<(poVar8," id=");
        cppcms::widgets::select_base::selected_id_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_2ae8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2ae8);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Radio: selected ");
        iVar4 = cppcms::widgets::select_base::selected();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
        poVar8 = std::operator<<(poVar8," id=");
        cppcms::widgets::select_base::selected_id_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,local_2b08);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_2b08);
      }
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        poVar8 = std::operator<<(local_2998,"Submit pressed: ");
        bVar3 = cppcms::widgets::submit::value();
        pvVar9 = (void *)std::ostream::operator<<(poVar8,(bool)(bVar3 & 1));
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
    if (bVar2) {
      cppcms::form::add((base_widget *)local_2888);
      cppcms::widgets::base_text::limits((int)local_268,2);
      load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
      bVar3 = cppcms::widgets::base_widget::set();
      if ((bVar3 & 1) != 0) {
        cppcms::application::response();
        poVar8 = (ostream *)cppcms::http::response::out();
        cppcms::widgets::base_text::value_abi_cxx11_();
        std::operator<<(poVar8,local_2be0);
        std::__cxx11::string::~string(local_2be0);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
      if (bVar2) {
        cppcms::form::add((base_widget *)local_2888);
        cppcms::widgets::numeric<double>::range
                  (in_stack_ffffffffffffc840,in_stack_ffffffffffffc838,
                   (double)in_stack_ffffffffffffc830);
        load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
        bVar3 = cppcms::widgets::base_widget::set();
        if ((bVar3 & 1) != 0) {
          cppcms::application::response();
          pvVar9 = (void *)cppcms::http::response::out();
          dVar11 = cppcms::widgets::numeric<double>::value
                             ((numeric<double> *)in_stack_ffffffffffffc870);
          std::ostream::operator<<(pvVar9,dVar11);
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
        if (bVar2) {
          cppcms::form::add((base_widget *)local_2888);
          cppcms::form::add((base_widget *)local_2888);
          cppcms::widgets::base_text::non_empty();
          cppcms::widgets::password::check_equal((password *)local_f00);
          load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
          if (bVar2) {
            cppcms::form::add((base_widget *)local_2888);
            load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
            cppcms::application::response();
            pvVar9 = (void *)cppcms::http::response::out();
            bVar3 = cppcms::widgets::checkbox::value();
            std::ostream::operator<<(pvVar9,(bool)(bVar3 & 1));
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828);
            if (bVar2) {
              cppcms::form::add((base_widget *)local_2888);
              cppcms::widgets::select_multiple::non_empty();
              cppcms::widgets::select_multiple::at_most((uint)local_18f0);
              load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
              cppcms::application::response();
              local_2be8 = (ostream *)cppcms::http::response::out();
              cppcms::widgets::select_multiple::selected_map();
              local_2c14 = 0;
              while( true ) {
                uVar5 = (ulong)local_2c14;
                sVar6 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffc870);
                poVar8 = local_2be8;
                if (sVar6 <= uVar5) break;
                rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)
                                    CONCAT17(in_stack_ffffffffffffc857,in_stack_ffffffffffffc850),
                                    in_stack_ffffffffffffc848);
                local_2c28 = rVar12;
                bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_2c28);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,bVar2);
                std::operator<<(poVar8," ");
                local_2c14 = local_2c14 + 1;
              }
              std::ostream::operator<<(local_2be8,std::endl<char,std::char_traits<char>>);
              cppcms::widgets::select_multiple::selected_ids_abi_cxx11_();
              local_2c60[0]._M_node =
                   (_Base_ptr)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(in_stack_ffffffffffffc828);
              while( true ) {
                local_2c68._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(in_stack_ffffffffffffc828);
                bVar2 = std::operator!=(local_2c60,&local_2c68);
                poVar8 = local_2be8;
                if (!bVar2) break;
                pbVar7 = std::
                         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_ffffffffffffc830);
                poVar8 = std::operator<<(poVar8,(string *)pbVar7);
                std::operator<<(poVar8," ");
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_ffffffffffffc830);
              }
              std::ostream::operator<<(local_2be8,std::endl<char,std::char_traits<char>>);
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1145fc);
              std::vector<bool,_std::allocator<bool>_>::~vector
                        ((vector<bool,_std::allocator<bool>_> *)0x114609);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffc830,(char *)in_stack_ffffffffffffc828
                                     );
              if (bVar2) {
                cppcms::form::add((base_widget *)local_2888);
                cppcms::widgets::select_base::non_empty();
                load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
                cppcms::application::response();
                pvVar9 = (void *)cppcms::http::response::out();
                iVar4 = cppcms::widgets::select_base::selected();
                poVar8 = (ostream *)std::ostream::operator<<(pvVar9,iVar4);
                poVar8 = std::operator<<(poVar8," ");
                cppcms::widgets::select_base::selected_id_abi_cxx11_();
                std::operator<<(poVar8,local_2c88);
                std::__cxx11::string::~string(local_2c88);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffc830,
                                        (char *)in_stack_ffffffffffffc828);
                if (bVar2) {
                  cppcms::form::add((base_widget *)local_2888);
                  cppcms::widgets::select_base::non_empty();
                  load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
                  cppcms::application::response();
                  pvVar9 = (void *)cppcms::http::response::out();
                  iVar4 = cppcms::widgets::select_base::selected();
                  poVar8 = (ostream *)std::ostream::operator<<(pvVar9,iVar4);
                  poVar8 = std::operator<<(poVar8," ");
                  cppcms::widgets::select_base::selected_id_abi_cxx11_();
                  std::operator<<(poVar8,local_2ca8);
                  std::__cxx11::string::~string(local_2ca8);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffc830,
                                          (char *)in_stack_ffffffffffffc828);
                  if (bVar2) {
                    cppcms::form::add((base_widget *)local_2888);
                    load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
                    cppcms::application::response();
                    pvVar9 = (void *)cppcms::http::response::out();
                    bVar3 = cppcms::widgets::submit::value();
                    std::ostream::operator<<(pvVar9,(bool)(bVar3 & 1));
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffc830,
                                            (char *)in_stack_ffffffffffffc828);
                    if (bVar2) {
                      cppcms::widgets::submit::submit((submit *)local_2f68);
                      lVar14 = (long)local_2f68 + *(long *)(local_2f68[0] + -0x18);
                      paVar13 = &local_2f89;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_2f88,"submit_id",paVar13);
                      cppcms::widgets::base_widget::id(lVar14,local_2f88);
                      std::__cxx11::string::~string(local_2f88);
                      std::allocator<char>::~allocator((allocator<char> *)&local_2f89);
                      lVar14 = *(long *)(local_2f68[0] + -0x18);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_2fb0,"submit_name",&local_2fb1);
                      cppcms::widgets::base_widget::name((long)local_2f68 + lVar14,local_2fb0);
                      std::__cxx11::string::~string(local_2fb0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_2fb1);
                      lVar14 = *(long *)(local_2f68[0] + -0x18);
                      booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
                      cppcms::widgets::base_widget::help
                                ((basic_message *)((long)local_2f68 + lVar14));
                      booster::locale::basic_message<char>::~basic_message
                                (in_stack_ffffffffffffc830);
                      lVar14 = *(long *)(local_2f68[0] + -0x18);
                      booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
                      cppcms::widgets::base_widget::error_message
                                ((basic_message *)((long)local_2f68 + lVar14));
                      booster::locale::basic_message<char>::~basic_message
                                (in_stack_ffffffffffffc830);
                      lVar14 = *(long *)(local_2f68[0] + -0x18);
                      booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
                      cppcms::widgets::base_widget::message
                                ((basic_message *)((long)local_2f68 + lVar14));
                      booster::locale::basic_message<char>::~basic_message
                                (in_stack_ffffffffffffc830);
                      cppcms::widgets::base_widget::valid
                                ((bool)((char)local_2f68 +
                                       (char)*(undefined8 *)(local_2f68[0] + -0x18)));
                      booster::locale::translate<char>((char *)in_stack_ffffffffffffc828);
                      cppcms::widgets::submit::value((basic_message *)local_2f68);
                      booster::locale::basic_message<char>::~basic_message
                                (in_stack_ffffffffffffc830);
                      cppcms::form::add((base_widget *)local_2888);
                      cppcms::application::response();
                      uVar10 = cppcms::http::response::out();
                      cppcms::form_context::form_context(local_31e0,uVar10,0);
                      cppcms::form::render((form_context *)local_2888);
                      cppcms::form_context::~form_context(local_31e0);
                      cppcms::widgets::submit::~submit((submit *)local_2f68);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffc830,
                                              (char *)in_stack_ffffffffffffc828);
                      if ((bVar2) ||
                         (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffc830,
                                                  (char *)in_stack_ffffffffffffc828), bVar2)) {
                        cppcms::widgets::file::non_empty();
                        lVar14 = *(long *)(local_22c8[0] + -0x18);
                        paVar13 = &local_3201;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3200,"file",paVar13);
                        cppcms::widgets::base_widget::name((long)local_22c8 + lVar14);
                        std::__cxx11::string::~string(local_3200);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3201);
                        cppcms::widgets::file::limits((int)local_22c8,0);
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_ffffffffffffc830,
                                                (char *)in_stack_ffffffffffffc828);
                        if (bVar2) {
                          paVar13 = &local_3229;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3228,"text/plain",paVar13);
                          cppcms::widgets::file::mime((string *)local_22c8);
                          std::__cxx11::string::~string(local_3228);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3229);
                        }
                        else {
                          paVar13 = &local_3259;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3258,"^text/(html|plain)$",paVar13);
                          booster::regex::regex(local_3238,local_3258,0);
                          cppcms::widgets::file::mime((regex *)local_22c8);
                          booster::regex::~regex(local_3238);
                          std::__cxx11::string::~string(local_3258);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3259);
                        }
                        paVar13 = &local_3281;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3280,"foo",paVar13);
                        cppcms::widgets::file::add_valid_magic((string *)local_22c8);
                        std::__cxx11::string::~string(local_3280);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3281);
                        in_stack_ffffffffffffc830 = (basic_message<char> *)local_32a9;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)(local_32a9 + 1),"P3",
                                   (allocator *)in_stack_ffffffffffffc830);
                        cppcms::widgets::file::add_valid_magic((string *)local_22c8);
                        std::__cxx11::string::~string((string *)(local_32a9 + 1));
                        std::allocator<char>::~allocator((allocator<char> *)local_32a9);
                        cppcms::form::add((base_widget *)local_2888);
                        load(in_stack_ffffffffffffc8b0,in_stack_ffffffffffffc8a8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cppcms::form::~form(local_2948);
  cppcms::form::~form(local_2918);
  cppcms::form::~form(local_28e8);
  cppcms::form::~form(local_28b8);
  cppcms::form::~form(local_2888);
  cppcms::widgets::file::~file((file *)local_22c8);
  cppcms::widgets::submit::~submit((submit *)local_2028);
  cppcms::widgets::radio::~radio(local_1d68);
  cppcms::widgets::select::~select(local_1b28);
  cppcms::widgets::select_multiple::~select_multiple(local_18f0);
  cppcms::widgets::checkbox::~checkbox((checkbox *)local_16c0);
  cppcms::widgets::email::~email((email *)local_1460);
  cppcms::widgets::regex_field::~regex_field((regex_field *)local_1198);
  cppcms::widgets::password::~password((password *)local_f00);
  cppcms::widgets::password::~password((password *)local_c68);
  cppcms::widgets::numeric<double>::~numeric((numeric<double> *)in_stack_ffffffffffffc830);
  cppcms::widgets::numeric<int>::~numeric((numeric<int> *)in_stack_ffffffffffffc830);
  cppcms::widgets::textarea::~textarea((textarea *)local_4f0);
  cppcms::widgets::text::~text((text *)local_298);
  return;
}

Assistant:

virtual void main(std::string a_case)
	{
		cppcms::widgets::text text;
		cppcms::widgets::textarea textarea;
		cppcms::widgets::numeric<int> integer;
		cppcms::widgets::numeric<double> real;
		cppcms::widgets::password p1,p2;
		cppcms::widgets::regex_field regex("^(yes|no)$");
		cppcms::widgets::email email;
		cppcms::widgets::checkbox checkbox;
		cppcms::widgets::select_multiple select_multiple;
		cppcms::widgets::select select;
		cppcms::widgets::radio radio;
		cppcms::widgets::submit submit;
		cppcms::widgets::file file;


		text.message("text");
		textarea.message("textarea");
		integer.message("int");
		real.message("double");
		p1.message("pass");
		p2.message("pass2");
		regex.message("yes or not");
		email.message("E-Mail");
		checkbox.message("Checkbox");
		select_multiple.message("Select Multiple");
		select.message("Select");
		radio.message("Radio");
		submit.message("Submit");
		submit.value("Button");

		select_multiple.add("a",true);
		select_multiple.add("b",true);
		select_multiple.add("c");
		select_multiple.add(cppcms::locale::translate("tr1"),std::string("id1"));

		select.add("a");
		select.add("b");
		select.add("c");
		select.add(cppcms::locale::translate("tr2"),"id2");
		select.selected_id("id2");

		radio.add("x");
		radio.add("y");
		radio.add(cppcms::locale::translate("tr3"),"id3");
		radio.selected(0);

		cppcms::form X,a,a1,a2,b;

		if(a_case.empty() || a_case == "/non_empty" || a_case=="/sub"){
			X.add(text);
			X.add(a);
			X.add(b);
			a.add(a1);
			a.add(a2);
			a1.add(textarea);
			a2.add(integer);
			a2.add(real);
			b.add(p1);
			b.add(p2);
			b.add(regex);
			b.add(email);
			b.add(checkbox);
			b.add(select_multiple);
			X.add(select);
			X.add(radio);
			X.add(submit);

			if(!a_case.empty()) {
				text.non_empty();
				textarea.non_empty();
				integer.non_empty();
				real.non_empty();
				p1.non_empty();
				p2.non_empty();
				regex.non_empty();
				email.non_empty();
				select_multiple.non_empty();
				select.non_empty();
				radio.non_empty();
			}

			if(request().request_method()=="POST" || !request().query_string().empty()) {
				response().set_plain_text_header();
				std::ostream &out = response().out();
				X.load(context());
				if(X.validate()) {
					out << "valid" << std::endl;
				}
				else {
					out << "invalid" << std::endl;
				}
				if(text.set()) out << "Text:" << text.value() << std::endl;
				if(textarea.set()) out << "Textarea:" << textarea.value() << std::endl;
				if(integer.set()) out << "Int:" << integer.value() << std::endl;
				if(real.set()) out << "Double:" << real.value() << std::endl;
				if(p1.set()) out << "p1:" << p1.value() << std::endl;
				if(p2.set()) out << "p2:" << p2.value() << std::endl;
				if(regex.set()) out << "regex: " << regex.value() << std::endl;
				if(email.set()) out << "email: " << email.value() << std::endl;
				if(checkbox.set()) out << "checkbox: " << checkbox.value() << std::endl;
				if(select_multiple.set()) {
					out << "selected m:";
					std::vector<bool> v=select_multiple.selected_map();
					for(unsigned i=0;i<v.size();i++)
						out << i << " ";
					out << std::endl;
					std::set<std::string> ids=select_multiple.selected_ids();
					out << "selected m ids:";
					for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
						out << *p << " ";
					out<< std::endl;
				}
				if(select.set()) 
					out << "Select: selected " << select.selected() << " id=" << select.selected_id() << std::endl;
				if(radio.set()) 
					out << "Radio: selected " << radio.selected() << " id=" << radio.selected_id() << std::endl;
				if(submit.set())
					out << "Submit pressed: " << submit.value() << std::endl;

			} 
			else if(a_case !="/sub") {
				std::ostream &out = response().out();
				out << "non loaded<br>\n";
				cppcms::form_context context(out);
				out << "<form action=\"" << request().script_name() + request().path_info() <<  "\" method=\"post\" >\n";
				X.render(context);
				out << "</form>\n";
			}
			else { // if (a_case=="/sub")
				cppcms::form_context context(response().out());
				b.render(context);
			}


		}
		else if(a_case == "/text") {
			X.add(text);
			text.limits(2,5);
			load(X);
			if(text.set()) {
				response().out() << text.value();
			}

		}
		else if(a_case == "/number") {
			X.add(real);
			real.range(5,100);
			load(X);
			if(real.set()) {
				response().out() << real.value();
			}

		}
		else if(a_case == "/pass") {
			X.add(p1);
			X.add(p2);
			p1.non_empty();
			p2.check_equal(p1);
			load(X);
		}
		else if(a_case == "/checkbox") {
			X.add(checkbox);
			load(X);
			response().out() << checkbox.value();
		}
		else if(a_case == "/sm") {
			X.add(select_multiple);
			select_multiple.non_empty();
			select_multiple.at_most(2);
			load(X);
			std::ostream &out = response().out();
			std::vector<bool> v=select_multiple.selected_map();
			for(unsigned i=0;i<v.size();i++)
				out << v[i] << " ";
			out << std::endl;
			std::set<std::string> ids=select_multiple.selected_ids();
			for(std::set<std::string>::const_iterator p=ids.begin();p!=ids.end();++p)
				out << *p << " ";
			out<< std::endl;
		}
		else if(a_case == "/select") {
			X.add(select);
			select.non_empty();
			load(X);
			response().out() << select.selected() <<" " << select.selected_id();
		}
		else if(a_case == "/radio") {
			X.add(radio);
			radio.non_empty();
			load(X);
			response().out() << radio.selected() <<" " << radio.selected_id();
		}
		else if(a_case == "/submit") {
			X.add(submit);
			load(X);
			response().out() << submit.value();
		}
		else if(a_case == "/submitl") {
			cppcms::widgets::submit s;
			s.id("submit_id");
			s.name("submit_name");
			s.help(cppcms::locale::translate("help"));
			s.error_message(cppcms::locale::translate("error"));
			s.message(cppcms::locale::translate("message"));
			s.valid(false);
			s.value(cppcms::locale::translate("test"));
			X.add(s);
			cppcms::form_context context(response().out());
			X.render(context);
		}
		else if(a_case == "/upload" || a_case== "/upload_regex" ) {
			file.non_empty();
			file.name("file");
			file.limits(0,20);
			if(a_case=="/upload")
				file.mime("text/plain");
			else
				file.mime(booster::regex("^text/(html|plain)$"));
			file.add_valid_magic("foo");
			file.add_valid_magic("P3");
			X.add(file);
			load(X);
		}
	}